

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patient.cpp
# Opt level: O2

string * __thiscall Patient::Gender_getter_abi_cxx11_(string *__return_storage_ptr__,Patient *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Gender);
  return __return_storage_ptr__;
}

Assistant:

string Patient :: Gender_getter(){
    return Gender;
}